

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

void mpi_sub_hlp(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *pmVar1;
  mbedtls_mpi_uint *pmVar2;
  mbedtls_mpi_uint *pmVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar9 = A->n;
  uVar6 = B->n;
  if (uVar9 < B->n) {
    uVar6 = uVar9;
  }
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    pmVar1 = A->p;
    pmVar2 = B->p;
    pmVar3 = X->p;
    uVar9 = 0;
    uVar8 = 0;
    do {
      uVar7 = uVar8;
      uVar4 = pmVar1[uVar9];
      uVar5 = pmVar2[uVar9];
      uVar8 = (ulong)(uVar4 - uVar7 < uVar5) + (ulong)(uVar4 < uVar7);
      pmVar3[uVar9] = (uVar4 - uVar7) - uVar5;
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
    uVar9 = A->n;
    if ((uVar6 < uVar9) && (uVar4 - uVar7 < uVar5 || uVar4 < uVar7)) {
      pmVar1 = A->p;
      pmVar2 = X->p;
      do {
        uVar9 = pmVar1[uVar6];
        bVar10 = uVar9 < uVar8;
        pmVar2[uVar6] = uVar9 - uVar8;
        uVar6 = uVar6 + 1;
        uVar9 = A->n;
        if (uVar9 <= uVar6) break;
        uVar8 = (ulong)bVar10;
      } while (bVar10);
    }
  }
  if (uVar6 < uVar9) {
    pmVar1 = A->p;
    pmVar2 = X->p;
    do {
      pmVar2[uVar6] = pmVar1[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 < A->n);
  }
  if (uVar6 < X->n) {
    pmVar1 = X->p;
    do {
      pmVar1[uVar6] = 0;
      uVar6 = uVar6 + 1;
    } while (uVar6 < X->n);
  }
  return;
}

Assistant:

static void mpi_sub_hlp( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    size_t i;
    mbedtls_mpi_uint c = 0;
    size_t width = A->n > B->n ? B->n : A->n;

    for( i = 0; i < width; i++ )
    {
        mbedtls_mpi_uint a = A->p[i];
        mbedtls_mpi_uint b = B->p[i];
        mbedtls_mpi_uint z = a < c;

        X->p[i] = a - c;
        c = ( X->p[i] <  b ) + z;
        X->p[i] -= b;
    }

    for( ; i < A->n && c > 0; i++ )
    {
        mbedtls_mpi_uint a = A->p[i];
        mbedtls_mpi_uint z = a < c;
        X->p[i] = a - c;
        c = z;
    }

    for( ; i < A->n; i++ )
    {
        X->p[i] = A->p[i];
    }

    for( ; i < X->n; i++ )
    {
        X->p[i] = 0;
    }
}